

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  MessageBuilder builder;
  SourceLineInfo local_260;
  string local_238;
  undefined1 local_218 [120];
  ostream local_1a0 [376];
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_00194790;
  AssertionResult::AssertionResult(&this->assertionResult,_assertionResult);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  sVar1 = (_totals->assertions).passed;
  sVar2 = (_totals->assertions).failed;
  sVar3 = (_totals->assertions).failedButOk;
  sVar4 = (_totals->testCases).passed;
  sVar5 = (_totals->testCases).failedButOk;
  (this->totals).testCases.failed = (_totals->testCases).failed;
  (this->totals).testCases.failedButOk = sVar5;
  (this->totals).assertions.failedButOk = sVar3;
  (this->totals).testCases.passed = sVar4;
  (this->totals).assertions.passed = sVar1;
  (this->totals).assertions.failed = sVar2;
  if ((this->assertionResult).m_resultData.message._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_238,(string *)&this->assertionResult);
    SourceLineInfo::SourceLineInfo(&local_260,&(this->assertionResult).m_info.lineInfo);
    MessageBuilder::MessageBuilder
              ((MessageBuilder *)local_218,&local_238,&local_260,
               (this->assertionResult).m_resultData.resultType);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::string
              ((string *)&local_260,(string *)&(this->assertionResult).m_resultData.message);
    std::operator<<(local_1a0,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)(local_218 + 0x50),(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,(value_type *)local_218);
    MessageBuilder::~MessageBuilder((MessageBuilder *)local_218);
  }
  return;
}

Assistant:

AssertionStats( AssertionResult const& _assertionResult,
                        std::vector<MessageInfo> const& _infoMessages,
                        Totals const& _totals )
        :   assertionResult( _assertionResult ),
            infoMessages( _infoMessages ),
            totals( _totals )
        {
            if( assertionResult.hasMessage() ) {
                // Copy message into messages list.
                // !TBD This should have been done earlier, somewhere
                MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
                builder << assertionResult.getMessage();
                builder.m_info.message = builder.m_stream.str();

                infoMessages.push_back( builder.m_info );
            }
        }